

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayFBOIncompleteness.cpp
# Opt level: O1

GLboolean __thiscall
glcts::TextureCubeMapArrayFBOIncompleteness::checkState
          (TextureCubeMapArrayFBOIncompleteness *this,GLint expected_state,char *message)

{
  GLboolean GVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x170))(0x8ca9);
  GVar1 = '\x01';
  if (iVar2 != expected_state) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (message == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,message,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"; FBO should be in ",0x13);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = expected_state;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," state, but is in : ",0x14);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," state",6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    GVar1 = '\0';
  }
  return GVar1;
}

Assistant:

glw::GLboolean TextureCubeMapArrayFBOIncompleteness::checkState(glw::GLint expected_state, const char* message)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLenum			  fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
	glw::GLboolean		  result		   = true;

	/* if fboCompleteness is different than expectedState log error */
	if (fbo_completeness != (glw::GLuint)expected_state)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << message << "; FBO should be in "
						   << glu::getErrorStr(expected_state)
						   << " state, but is in : " << glu::getErrorStr(fbo_completeness) << " state"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}